

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_go.cpp
# Opt level: O0

void __thiscall
flatbuffers::go::GoGenerator::GenStruct(GoGenerator *this,StructDef *struct_def,string *code_ptr)

{
  FieldDef *field_00;
  bool bVar1;
  reference ppFVar2;
  FieldDef *field;
  __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
  local_28;
  const_iterator it;
  string *code_ptr_local;
  StructDef *struct_def_local;
  GoGenerator *this_local;
  
  if (((struct_def->super_Definition).generated & 1U) == 0) {
    this->cur_name_space_ = (struct_def->super_Definition).defined_namespace;
    it._M_current = (FieldDef **)code_ptr;
    GenComment(&(struct_def->super_Definition).doc_comment,code_ptr,(CommentConfig *)0x0,"");
    if (((((this->super_BaseGenerator).parser_)->opts).generate_object_based_api & 1U) != 0) {
      GenNativeStruct(this,struct_def,(string *)it._M_current);
    }
    BeginClass(this,struct_def,(string *)it._M_current);
    if ((struct_def->fixed & 1U) == 0) {
      NewRootTypeFromBuffer(this,struct_def,(string *)it._M_current);
    }
    InitializeExisting(this,struct_def,(string *)it._M_current);
    GenTableAccessor(this,struct_def,(string *)it._M_current);
    local_28._M_current =
         (FieldDef **)
         std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::begin
                   (&(struct_def->fields).vec);
    while( true ) {
      field = (FieldDef *)
              std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::end
                        (&(struct_def->fields).vec);
      bVar1 = __gnu_cxx::operator!=
                        (&local_28,
                         (__normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
                          *)&field);
      if (!bVar1) break;
      ppFVar2 = __gnu_cxx::
                __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
                ::operator*(&local_28);
      field_00 = *ppFVar2;
      if ((field_00->deprecated & 1U) == 0) {
        GenStructAccessor(this,struct_def,field_00,(string *)it._M_current);
        GenStructMutator(this,struct_def,field_00,(string *)it._M_current);
        if (((struct_def->fixed & 1U) == 0) && ((field_00->key & 1U) != 0)) {
          GenKeyCompare(this,struct_def,field_00,(string *)it._M_current);
          GenLookupByKey(this,struct_def,field_00,(string *)it._M_current);
        }
      }
      __gnu_cxx::
      __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
      ::operator++(&local_28);
    }
    if ((struct_def->fixed & 1U) == 0) {
      GenTableBuilders(this,struct_def,(string *)it._M_current);
    }
    else {
      GenStructBuilder(this,struct_def,(string *)it._M_current);
    }
  }
  return;
}

Assistant:

void GenStruct(const StructDef &struct_def, std::string *code_ptr) {
    if (struct_def.generated) return;

    cur_name_space_ = struct_def.defined_namespace;

    GenComment(struct_def.doc_comment, code_ptr, nullptr);
    if (parser_.opts.generate_object_based_api) {
      GenNativeStruct(struct_def, code_ptr);
    }
    BeginClass(struct_def, code_ptr);
    if (!struct_def.fixed) {
      // Generate a special accessor for the table that has been declared as
      // the root type.
      NewRootTypeFromBuffer(struct_def, code_ptr);
    }
    // Generate the Init method that sets the field in a pre-existing
    // accessor object. This is to allow object reuse.
    InitializeExisting(struct_def, code_ptr);
    // Generate _tab accessor
    GenTableAccessor(struct_def, code_ptr);

    // Generate struct fields accessors
    for (auto it = struct_def.fields.vec.begin();
         it != struct_def.fields.vec.end(); ++it) {
      auto &field = **it;
      if (field.deprecated) continue;

      GenStructAccessor(struct_def, field, code_ptr);
      GenStructMutator(struct_def, field, code_ptr);
      // TODO(michaeltle): Support querying fixed struct by key. Currently,
      // we only support keyed tables.
      if (!struct_def.fixed && field.key) {
        GenKeyCompare(struct_def, field, code_ptr);
        GenLookupByKey(struct_def, field, code_ptr);
      }
    }

    // Generate builders
    if (struct_def.fixed) {
      // create a struct constructor function
      GenStructBuilder(struct_def, code_ptr);
    } else {
      // Create a set of functions that allow table construction.
      GenTableBuilders(struct_def, code_ptr);
    }
  }